

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::AssertSnapEquivTTDVar_Helper
               (TTDVar v1,TTDVar v2,TTDCompareMap *compareMap,StepKind stepKind,PathEntry *next)

{
  bool bVar1;
  
  if (v1 == (TTDVar)0x0 || v2 == (TTDVar)0x0) {
    bVar1 = v1 == v2;
  }
  else {
    bVar1 = Js::VarIs<Js::RecyclableObject>(v1);
    if (bVar1) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(v2);
      if (bVar1) {
        TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Helper
                  (compareMap,(TTD_PTR_ID)v1,(TTD_PTR_ID)v2,stepKind,next);
        return;
      }
    }
    bVar1 = JsSupport::AreInlineVarsEquiv(v1,v2);
  }
  TTDCompareMap::DiagnosticAssert(compareMap,bVar1);
  return;
}

Assistant:

void AssertSnapEquivTTDVar_Helper(const TTDVar v1, const TTDVar v2, TTDCompareMap& compareMap, TTDComparePath::StepKind stepKind, const TTDComparePath::PathEntry& next)
        {
            if(v1 == nullptr || v2 == nullptr)
            {
                compareMap.DiagnosticAssert(v1 == v2);
            }
            else if(Js::TaggedNumber::Is(v1) || Js::TaggedNumber::Is(v2))
            {
                compareMap.DiagnosticAssert(JsSupport::AreInlineVarsEquiv(v1, v2));
            }
            else
            {
                compareMap.CheckConsistentAndAddPtrIdMapping_Helper(TTD_CONVERT_VAR_TO_PTR_ID(v1), TTD_CONVERT_VAR_TO_PTR_ID(v2), stepKind, next);
            }
        }